

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe(uv_os_fd_t *fds,int read_flags,int write_flags)

{
  int iVar1;
  uv_os_fd_t in_RAX [2];
  int *piVar2;
  uint uVar3;
  uv_os_fd_t temp [2];
  
  uVar3 = (uint)((read_flags & 0x40U & write_flags) != 0);
  temp = in_RAX;
  iVar1 = pipe2(temp,uVar3 << 0xb | 0x80000);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    return -*piVar2;
  }
  if (uVar3 == 0) {
    if ((read_flags & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl(temp[0],1);
      if (iVar1 != 0) goto LAB_0017eeac;
    }
    if ((write_flags & 0x40U) != 0) {
      iVar1 = uv__nonblock_ioctl(temp[1],1);
      if (iVar1 != 0) {
LAB_0017eeac:
        uv__close(temp[0]);
        uv__close(temp[1]);
        return iVar1;
      }
    }
  }
  *(uv_os_fd_t (*) [2])fds = temp;
  return 0;
}

Assistant:

int uv_pipe(uv_os_fd_t fds[2], int read_flags, int write_flags) {
  uv_os_fd_t temp[2];
  int err;
#if defined(__FreeBSD__) || defined(__linux__)
  int flags = O_CLOEXEC;

  if ((read_flags & UV_NONBLOCK_PIPE) && (write_flags & UV_NONBLOCK_PIPE))
    flags |= UV_FS_O_NONBLOCK;

  if (pipe2(temp, flags))
    return UV__ERR(errno);

  if (flags & UV_FS_O_NONBLOCK) {
    fds[0] = temp[0];
    fds[1] = temp[1];
    return 0;
  }
#else
  if (pipe(temp))
    return UV__ERR(errno);

  if ((err = uv__cloexec(temp[0], 1)))
    goto fail;

  if ((err = uv__cloexec(temp[1], 1)))
    goto fail;
#endif

  if (read_flags & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[0], 1)))
      goto fail;

  if (write_flags & UV_NONBLOCK_PIPE)
    if ((err = uv__nonblock(temp[1], 1)))
      goto fail;

  fds[0] = temp[0];
  fds[1] = temp[1];
  return 0;

fail:
  uv__close(temp[0]);
  uv__close(temp[1]);
  return err;
}